

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O3

void __thiscall ot::commissioner::CommissionerImpl::Disconnect(CommissionerImpl *this)

{
  char cVar1;
  pointer puVar2;
  char *from;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  char *to;
  format_args args;
  writer write;
  writer local_a8;
  undefined1 local_a0 [8];
  _Alloc_hider local_98;
  char local_88 [16];
  string local_78;
  format_string_checker<char> local_58;
  
  local_58.types_[0] = none_type;
  from = "the CoAPs client was disconnected";
  local_58.context_.super_basic_format_parse_context<char>.format_str_.data_ =
       "the CoAPs client was disconnected";
  local_58.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x21;
  local_58.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
  local_58.context_.super_basic_format_parse_context<char>._20_4_ = 0;
  local_58.parse_funcs_[0] = (parse_func)0x0;
  local_a8.handler_ = &local_58;
  local_58.context_.types_ = local_58.types_;
  do {
    cVar1 = *from;
    to = from;
    while (cVar1 != '{') {
      to = to + 1;
      if (to == "") {
        fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
        operator()(&local_a8,from,"");
        goto LAB_001919a9;
      }
      cVar1 = *to;
    }
    fmt::v10::detail::
    parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
    operator()(&local_a8,from,to);
    from = fmt::v10::detail::
           parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                     (to,"",&local_58);
  } while (from != "");
LAB_001919a9:
  args.field_1.args_ = in_R9.args_;
  args.desc_ = (unsigned_long_long)&local_58;
  fmt::v10::vformat_abi_cxx11_
            (&local_78,(v10 *)"the CoAPs client was disconnected",(string_view)ZEXT816(0x21),args);
  local_a0._0_4_ = kCancelled;
  local_98._M_p = local_88;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_98,local_78._M_dataplus._M_p,
             local_78._M_dataplus._M_p + local_78._M_string_length);
  coap::CoapSecure::Disconnect(&this->mBrClient,(Error *)local_a0);
  if (local_98._M_p != local_88) {
    operator_delete(local_98._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  puVar2 = (this->mProxyClient).mMeshLocalPrefix.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->mProxyClient).mMeshLocalPrefix.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar2) {
    (this->mProxyClient).mMeshLocalPrefix.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar2;
  }
  this->mState = kDisabled;
  return;
}

Assistant:

void CommissionerImpl::Disconnect()
{
    mBrClient.Disconnect(ERROR_CANCELLED("the CoAPs client was disconnected"));
    mProxyClient.ClearMeshLocalPrefix();
    mState = State::kDisabled;
}